

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fyl2xp1_x86_64(CPUX86State *env)

{
  float_status *status;
  undefined2 uVar1;
  uint uVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  floatx80 a;
  floatx80 fVar6;
  
  status = &env->fp_status;
  fVar6._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
  fVar6.low = env->fpregs[env->fpstt].d.low;
  fVar6._12_4_ = 0;
  dVar3 = (double)floatx80_to_float64_x86_64(fVar6,status);
  if (dVar3 + 1.0 <= 0.0) {
    uVar1 = env->fpus;
    env->fpus = uVar1 & 0xb8ff | 0x400;
  }
  else {
    dVar5 = log(dVar3 + 1.0);
    uVar4 = (ulong)((env->fpstt + 1 & 7) << 4);
    a._8_4_ = *(undefined4 *)((long)env->fpregs + uVar4 + 8);
    a.low = *(undefined8 *)((long)env->fpregs + uVar4);
    a._12_4_ = 0;
    dVar3 = (double)floatx80_to_float64_x86_64(a,status);
    uVar4 = (ulong)((env->fpstt + 1 & 7) << 4);
    fVar6 = float64_to_floatx80_x86_64((float64)(dVar3 * (dVar5 / 0.6931471805599453)),status);
    *(uint64_t *)((long)env->fpregs + uVar4) = fVar6.low;
    *(uint16_t *)((long)env->fpregs + uVar4 + 8) = fVar6.high;
    uVar2 = env->fpstt;
    env->fptags[uVar2] = '\x01';
    env->fpstt = uVar2 + 1 & 7;
  }
  return;
}

Assistant:

void helper_fyl2xp1(CPUX86State *env)
{
    double fptemp = floatx80_to_double(env, ST0);

    if ((fptemp + 1.0) > 0.0) {
        fptemp = log(fptemp + 1.0) / log(2.0); /* log2(ST + 1.0) */
        fptemp *= floatx80_to_double(env, ST1);
        ST1 = double_to_floatx80(env, fptemp);
        fpop(env);
    } else {
        env->fpus &= ~0x4700;
        env->fpus |= 0x400;
    }
}